

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O0

void Sbd_ProblemCollectSolution(int nStrs,Sbd_Str_t *pStr0,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  word wVar3;
  int local_34;
  int local_30;
  int iLit;
  int nIters;
  int m;
  Sbd_Str_t *pStr;
  Vec_Int_t *vLits_local;
  Sbd_Str_t *pStr0_local;
  int nStrs_local;
  
  local_34 = 0;
  _nIters = pStr0;
  do {
    if (pStr0 + nStrs <= _nIters) {
      iVar2 = Vec_IntSize(vLits);
      if (local_34 != iVar2) {
        __assert_fail("iLit == Vec_IntSize(vLits)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0xad,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
      }
      return;
    }
    _nIters->Res = 0;
    if (_nIters->fLut == 0) {
      local_30 = 0;
      for (iLit = 0; iLit < _nIters->nVarIns; iLit = iLit + 1) {
        iVar2 = Vec_IntEntry(vLits,local_34);
        iVar2 = Abc_LitIsCompl(iVar2);
        if (iVar2 == 0) {
          _nIters->Res = (long)_nIters->VarIns[iLit];
          local_30 = local_30 + 1;
        }
        local_34 = local_34 + 1;
      }
      if (local_30 != 1) {
        __assert_fail("nIters == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0xaa,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
      }
    }
    else {
      iVar2 = _nIters->nVarIns;
      for (iLit = 0; iLit < 1 << ((byte)iVar2 & 0x1f); iLit = iLit + 1) {
        iVar1 = Vec_IntEntry(vLits,local_34);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar1 == 0) {
          Abc_TtSetBit(&_nIters->Res,iLit);
        }
        local_34 = local_34 + 1;
      }
      wVar3 = Abc_Tt6Stretch(_nIters->Res,_nIters->nVarIns);
      _nIters->Res = wVar3;
    }
    _nIters = _nIters + 1;
  } while( true );
}

Assistant:

void Sbd_ProblemCollectSolution( int nStrs, Sbd_Str_t * pStr0, Vec_Int_t * vLits )
{
    Sbd_Str_t * pStr;
    int m, nIters, iLit = 0;
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++ )
    {
        pStr->Res = 0;
        if ( pStr->fLut )
        {
            nIters = 1 << pStr->nVarIns;
            for ( m = 0; m < nIters; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                    Abc_TtSetBit( &pStr->Res, m );
            pStr->Res = Abc_Tt6Stretch( pStr->Res, pStr->nVarIns );
        }
        else
        {
            nIters = 0;
            for ( m = 0; m < pStr->nVarIns; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                {
                    pStr->Res = pStr->VarIns[m];
                    nIters++;
                }
            assert( nIters == 1 );
        }
    }
    assert( iLit == Vec_IntSize(vLits) );
}